

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

DynamicProfileInfo *
Js::DynamicProfileInfo::Deserialize<Js::BufferReader>
          (BufferReader *reader,Recycler *recycler,LocalFunctionId *functionId)

{
  code *pcVar1;
  LocalFunctionId *pLVar2;
  bool bVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  BVUnit *data;
  DynamicProfileInfo *this;
  OutOfMemoryException anon_var_0;
  TrackAllocData local_428;
  DynamicProfileInfo *local_400;
  DynamicProfileInfo *dynamicProfileInfo;
  undefined8 local_3f0;
  TrackAllocData local_3e8;
  DynamicProfileFunctionInfo *local_3c0;
  DynamicProfileFunctionInfo *dynamicProfileFunctionInfo;
  undefined8 local_3b0;
  TrackAllocData local_3a8;
  code *local_380;
  undefined8 local_378;
  TrackAllocData local_370;
  code *local_348;
  undefined8 local_340;
  TrackAllocData local_338;
  code *local_310;
  undefined8 local_308;
  TrackAllocData local_300;
  code *local_2d8;
  undefined8 local_2d0;
  TrackAllocData local_2c8;
  code *local_2a0;
  undefined8 local_298;
  TrackAllocData local_290;
  code *local_268;
  undefined8 local_260;
  TrackAllocData local_258;
  code *local_230;
  undefined8 local_228;
  TrackAllocData local_220;
  code *local_1f8;
  undefined8 local_1f0;
  TrackAllocData local_1e8;
  code *local_1c0;
  undefined8 local_1b8;
  TrackAllocData local_1b0;
  code *local_188;
  undefined8 local_180;
  TrackAllocData local_178;
  code *local_150;
  undefined8 local_148;
  TrackAllocData local_140;
  code *local_118;
  undefined8 local_110;
  TrackAllocData local_108;
  int local_e0;
  AutoNestedHandledExceptionType local_cc;
  uint local_c8;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  uint32 recursiveInlineInfo;
  Type local_bc;
  Bits bits;
  ThisInfo thisInfo;
  ImplicitCallFlags implicitCallFlags;
  BVFixed *loopFlags;
  ImplicitCallFlags *loopImplicitCallFlags;
  ValueType *returnTypeInfo;
  ValueType *switchTypeInfo;
  ValueType *divTypeInfo;
  CallSiteInfo *callApplyTargetInfo;
  CallSiteInfo *callSiteInfo;
  ValueType *slotInfo;
  FldInfo *fldInfo;
  ArrayCallSiteInfo *arrayCallSiteInfo;
  StElemInfo *stElemInfo;
  LdElemInfo *ldElemInfo;
  LdLenInfo *ldLenInfo;
  ValueType *paramInfo;
  uint loopCount;
  uint fldInfoCount;
  unsigned_short local_38;
  ProfileId switchCount;
  ProfileId divCount;
  ProfileId returnTypeInfoCount;
  ProfileId callApplyTargetInfoCount;
  ProfileId callSiteInfoCount;
  ProfileId slotInfoCount;
  ProfileId arrayCallSiteCount;
  ProfileId stElemInfoCount;
  ProfileId ldElemInfoCount;
  ProfileId ldLenInfoCount;
  ArgSlot paramInfoCount;
  LocalFunctionId *functionId_local;
  Recycler *recycler_local;
  BufferReader *reader_local;
  
  arrayCallSiteCount = 0;
  slotInfoCount = 0;
  callSiteInfoCount = 0;
  callApplyTargetInfoCount = 0;
  returnTypeInfoCount = 0;
  divCount = 0;
  switchCount = 0;
  local_38 = 0;
  fldInfoCount._2_2_ = 0;
  fldInfoCount._0_2_ = 0;
  loopCount._2_2_ = 0;
  paramInfo._4_4_ = 0;
  paramInfo._0_4_ = 0;
  ldLenInfo = (LdLenInfo *)0x0;
  ldElemInfo = (LdElemInfo *)0x0;
  stElemInfo = (StElemInfo *)0x0;
  arrayCallSiteInfo = (ArrayCallSiteInfo *)0x0;
  fldInfo = (FldInfo *)0x0;
  slotInfo = (ValueType *)0x0;
  callSiteInfo = (CallSiteInfo *)0x0;
  callApplyTargetInfo = (CallSiteInfo *)0x0;
  divTypeInfo = (ValueType *)0x0;
  switchTypeInfo = (ValueType *)0x0;
  returnTypeInfo = (ValueType *)0x0;
  loopImplicitCallFlags = (ImplicitCallFlags *)0x0;
  loopFlags = (BVFixed *)0x0;
  stack0xffffffffffffff48 = (BVFixed *)0x0;
  _stElemInfoCount = functionId;
  functionId_local = &recycler->Cookie;
  recycler_local = (Recycler *)reader;
  ThisInfo::ThisInfo((ThisInfo *)((long)&recursiveInlineInfo + 2));
  local_c8 = 0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_cc,ExceptionType_OutOfMemory);
  bVar3 = BufferReader::Read<unsigned_int>((BufferReader *)recycler_local,_stElemInfoCount);
  if (bVar3) {
    bVar3 = BufferReader::Read<unsigned_short>((BufferReader *)recycler_local,&arrayCallSiteCount);
    pLVar2 = functionId_local;
    if (bVar3) {
      if (arrayCallSiteCount != 0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_108,(type_info *)&ValueType::typeinfo,0,(ulong)arrayCallSiteCount,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                   ,0x8d2);
        pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_108);
        local_118 = Memory::Recycler::AllocLeaf;
        local_110 = 0;
        ldLenInfo = (LdLenInfo *)
                    Memory::AllocateArray<Memory::Recycler,ValueType,false>
                              ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                               (ulong)arrayCallSiteCount);
        bVar3 = BufferReader::ReadArray<ValueType>
                          ((BufferReader *)recycler_local,(ValueType *)ldLenInfo,
                           (ulong)arrayCallSiteCount);
        if (!bVar3) {
          local_e0 = 6;
          goto LAB_00db26f9;
        }
      }
      bVar3 = BufferReader::Read<unsigned_short>((BufferReader *)recycler_local,&slotInfoCount);
      pLVar2 = functionId_local;
      if (bVar3) {
        if (slotInfoCount != 0) {
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_140,(type_info *)&LdLenInfo::typeinfo,0,(ulong)slotInfoCount,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                     ,0x8e0);
          pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_140);
          local_150 = Memory::Recycler::AllocLeaf;
          local_148 = 0;
          ldElemInfo = (LdElemInfo *)
                       Memory::AllocateArray<Memory::Recycler,Js::LdLenInfo,false>
                                 ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                  (ulong)slotInfoCount);
          bVar3 = BufferReader::ReadArray<Js::LdLenInfo>
                            ((BufferReader *)recycler_local,(LdLenInfo *)ldElemInfo,
                             (ulong)slotInfoCount);
          if (!bVar3) {
            local_e0 = 6;
            goto LAB_00db26f9;
          }
        }
        bVar3 = BufferReader::Read<unsigned_short>
                          ((BufferReader *)recycler_local,&callSiteInfoCount);
        pLVar2 = functionId_local;
        if (bVar3) {
          if (callSiteInfoCount != 0) {
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_178,(type_info *)&LdElemInfo::typeinfo,0,(ulong)callSiteInfoCount,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                       ,0x8ee);
            pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_178);
            local_188 = Memory::Recycler::AllocLeaf;
            local_180 = 0;
            stElemInfo = (StElemInfo *)
                         Memory::AllocateArray<Memory::Recycler,Js::LdElemInfo,false>
                                   ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                    (ulong)callSiteInfoCount);
            bVar3 = BufferReader::ReadArray<Js::LdElemInfo>
                              ((BufferReader *)recycler_local,(LdElemInfo *)stElemInfo,
                               (ulong)callSiteInfoCount);
            if (!bVar3) {
              local_e0 = 6;
              goto LAB_00db26f9;
            }
          }
          bVar3 = BufferReader::Read<unsigned_short>
                            ((BufferReader *)recycler_local,&callApplyTargetInfoCount);
          pLVar2 = functionId_local;
          if (bVar3) {
            if (callApplyTargetInfoCount != 0) {
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_1b0,(type_info *)&StElemInfo::typeinfo,0,
                         (ulong)callApplyTargetInfoCount,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                         ,0x8fc);
              pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_1b0);
              local_1c0 = Memory::Recycler::AllocLeaf;
              local_1b8 = 0;
              arrayCallSiteInfo =
                   (ArrayCallSiteInfo *)
                   Memory::AllocateArray<Memory::Recycler,Js::StElemInfo,false>
                             ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                              (ulong)callApplyTargetInfoCount);
              bVar3 = BufferReader::ReadArray<Js::StElemInfo>
                                ((BufferReader *)recycler_local,(StElemInfo *)arrayCallSiteInfo,
                                 (ulong)callApplyTargetInfoCount);
              if (!bVar3) {
                local_e0 = 6;
                goto LAB_00db26f9;
              }
            }
            bVar3 = BufferReader::Read<unsigned_short>
                              ((BufferReader *)recycler_local,&returnTypeInfoCount);
            pLVar2 = functionId_local;
            if (bVar3) {
              if (returnTypeInfoCount != 0) {
                Memory::TrackAllocData::CreateTrackAllocData
                          (&local_1e8,(type_info *)&ArrayCallSiteInfo::typeinfo,0,
                           (ulong)returnTypeInfoCount,
                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                           ,0x90a);
                pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_1e8);
                local_1f8 = Memory::Recycler::AllocLeaf;
                local_1f0 = 0;
                fldInfo = (FldInfo *)
                          Memory::AllocateArray<Memory::Recycler,Js::ArrayCallSiteInfo,false>
                                    ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                     (ulong)returnTypeInfoCount);
                bVar3 = BufferReader::ReadArray<Js::ArrayCallSiteInfo>
                                  ((BufferReader *)recycler_local,(ArrayCallSiteInfo *)fldInfo,
                                   (ulong)returnTypeInfoCount);
                if (!bVar3) {
                  local_e0 = 6;
                  goto LAB_00db26f9;
                }
              }
              bVar3 = BufferReader::Read<unsigned_int>
                                ((BufferReader *)recycler_local,(uint *)((long)&paramInfo + 4));
              pLVar2 = functionId_local;
              if (bVar3) {
                if (paramInfo._4_4_ != 0) {
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_220,(type_info *)&FldInfo::typeinfo,0,(ulong)paramInfo._4_4_,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                             ,0x918);
                  pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_220);
                  local_230 = Memory::Recycler::AllocLeaf;
                  local_228 = 0;
                  slotInfo = &Memory::AllocateArray<Memory::Recycler,Js::FldInfo,false>
                                        ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                         (ulong)paramInfo._4_4_)->valueType;
                  bVar3 = BufferReader::ReadArray<Js::FldInfo>
                                    ((BufferReader *)recycler_local,(FldInfo *)slotInfo,
                                     (ulong)paramInfo._4_4_);
                  if (!bVar3) {
                    local_e0 = 6;
                    goto LAB_00db26f9;
                  }
                }
                bVar3 = BufferReader::Read<unsigned_short>((BufferReader *)recycler_local,&divCount)
                ;
                pLVar2 = functionId_local;
                if (bVar3) {
                  if (divCount != 0) {
                    Memory::TrackAllocData::CreateTrackAllocData
                              (&local_258,(type_info *)&ValueType::typeinfo,0,(ulong)divCount,
                               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                               ,0x926);
                    pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_258);
                    local_268 = Memory::Recycler::AllocLeaf;
                    local_260 = 0;
                    callSiteInfo = (CallSiteInfo *)
                                   Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                             ((Memory *)pRVar6,
                                              (Recycler *)Memory::Recycler::AllocLeaf,0,
                                              (ulong)divCount);
                    bVar3 = BufferReader::ReadArray<ValueType>
                                      ((BufferReader *)recycler_local,(ValueType *)callSiteInfo,
                                       (ulong)divCount);
                    if (!bVar3) {
                      local_e0 = 6;
                      goto LAB_00db26f9;
                    }
                  }
                  bVar3 = BufferReader::Read<unsigned_short>
                                    ((BufferReader *)recycler_local,&switchCount);
                  pLVar2 = functionId_local;
                  if (bVar3) {
                    if (switchCount != 0) {
                      Memory::TrackAllocData::CreateTrackAllocData
                                (&local_290,(type_info *)&CallSiteInfo::typeinfo,0,
                                 (ulong)switchCount,
                                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                 ,0x937);
                      pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_290);
                      local_2a0 = Memory::Recycler::AllocLeaf;
                      local_298 = 0;
                      callApplyTargetInfo =
                           Memory::AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                     ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                      (ulong)switchCount);
                      bVar3 = BufferReader::ReadArray<Js::CallSiteInfo>
                                        ((BufferReader *)recycler_local,callApplyTargetInfo,
                                         (ulong)switchCount);
                      if (!bVar3) {
                        local_e0 = 6;
                        goto LAB_00db26f9;
                      }
                    }
                    bVar3 = BufferReader::Read<unsigned_short>
                                      ((BufferReader *)recycler_local,&local_38);
                    pLVar2 = functionId_local;
                    if (bVar3) {
                      if (local_38 != 0) {
                        Memory::TrackAllocData::CreateTrackAllocData
                                  (&local_2c8,(type_info *)&CallSiteInfo::typeinfo,0,(ulong)local_38
                                   ,
                                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                   ,0x948);
                        pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_2c8);
                        local_2d8 = Memory::Recycler::AllocLeaf;
                        local_2d0 = 0;
                        divTypeInfo = &Memory::
                                       AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                                 ((Memory *)pRVar6,
                                                  (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                  (ulong)local_38)->returnType;
                        bVar3 = BufferReader::ReadArray<Js::CallSiteInfo>
                                          ((BufferReader *)recycler_local,
                                           (CallSiteInfo *)divTypeInfo,(ulong)local_38);
                        if (!bVar3) {
                          local_e0 = 6;
                          goto LAB_00db26f9;
                        }
                      }
                      bVar3 = BufferReader::Read<unsigned_short>
                                        ((BufferReader *)recycler_local,
                                         (unsigned_short *)&fldInfoCount);
                      pLVar2 = functionId_local;
                      if (bVar3) {
                        if ((Type)fldInfoCount != 0) {
                          Memory::TrackAllocData::CreateTrackAllocData
                                    (&local_300,(type_info *)&ValueType::typeinfo,0,
                                     (ulong)(Type)fldInfoCount,
                                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                     ,0x956);
                          pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_300);
                          local_310 = Memory::Recycler::AllocLeaf;
                          local_308 = 0;
                          switchTypeInfo =
                               Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                         ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0
                                          ,(ulong)(Type)fldInfoCount);
                          bVar3 = BufferReader::ReadArray<ValueType>
                                            ((BufferReader *)recycler_local,switchTypeInfo,
                                             (ulong)(Type)fldInfoCount);
                          if (!bVar3) {
                            local_e0 = 6;
                            goto LAB_00db26f9;
                          }
                        }
                        bVar3 = BufferReader::Read<unsigned_short>
                                          ((BufferReader *)recycler_local,
                                           (unsigned_short *)((long)&loopCount + 2));
                        pLVar2 = functionId_local;
                        if (bVar3) {
                          if (loopCount._2_2_ != 0) {
                            Memory::TrackAllocData::CreateTrackAllocData
                                      (&local_338,(type_info *)&ValueType::typeinfo,0,
                                       (ulong)loopCount._2_2_,
                                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                       ,0x964);
                            pRVar6 = Memory::Recycler::TrackAllocInfo((Recycler *)pLVar2,&local_338)
                            ;
                            local_348 = Memory::Recycler::AllocLeaf;
                            local_340 = 0;
                            returnTypeInfo =
                                 Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                           ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf
                                            ,0,(ulong)loopCount._2_2_);
                            bVar3 = BufferReader::ReadArray<ValueType>
                                              ((BufferReader *)recycler_local,returnTypeInfo,
                                               (ulong)loopCount._2_2_);
                            if (!bVar3) {
                              local_e0 = 6;
                              goto LAB_00db26f9;
                            }
                          }
                          bVar3 = BufferReader::Read<unsigned_short>
                                            ((BufferReader *)recycler_local,
                                             (unsigned_short *)((long)&fldInfoCount + 2));
                          pLVar2 = functionId_local;
                          if (bVar3) {
                            if (fldInfoCount._2_2_ != 0) {
                              Memory::TrackAllocData::CreateTrackAllocData
                                        (&local_370,(type_info *)&ValueType::typeinfo,0,
                                         (ulong)fldInfoCount._2_2_,
                                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                         ,0x972);
                              pRVar6 = Memory::Recycler::TrackAllocInfo
                                                 ((Recycler *)pLVar2,&local_370);
                              local_380 = Memory::Recycler::AllocLeaf;
                              local_378 = 0;
                              loopImplicitCallFlags =
                                   (ImplicitCallFlags *)
                                   Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                             ((Memory *)pRVar6,
                                              (Recycler *)Memory::Recycler::AllocLeaf,0,
                                              (ulong)fldInfoCount._2_2_);
                              bVar3 = BufferReader::ReadArray<ValueType>
                                                ((BufferReader *)recycler_local,
                                                 (ValueType *)loopImplicitCallFlags,
                                                 (ulong)fldInfoCount._2_2_);
                              if (!bVar3) {
                                local_e0 = 6;
                                goto LAB_00db26f9;
                              }
                            }
                            bVar3 = BufferReader::Read<unsigned_int>
                                              ((BufferReader *)recycler_local,(uint *)&paramInfo);
                            pLVar2 = functionId_local;
                            if (bVar3) {
                              if ((Type)paramInfo != 0) {
                                Memory::TrackAllocData::CreateTrackAllocData
                                          (&local_3a8,(type_info *)&ImplicitCallFlags::typeinfo,0,
                                           (ulong)(Type)paramInfo,
                                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                           ,0x980);
                                pRVar6 = Memory::Recycler::TrackAllocInfo
                                                   ((Recycler *)pLVar2,&local_3a8);
                                dynamicProfileFunctionInfo =
                                     (DynamicProfileFunctionInfo *)Memory::Recycler::AllocLeaf;
                                local_3b0 = 0;
                                loopFlags = (BVFixed *)
                                            Memory::
                                            AllocateArray<Memory::Recycler,Js::ImplicitCallFlags,false>
                                                      ((Memory *)pRVar6,
                                                       (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                       (ulong)(Type)paramInfo);
                                bVar3 = BufferReader::ReadArray<Js::ImplicitCallFlags>
                                                  ((BufferReader *)recycler_local,
                                                   (ImplicitCallFlags *)loopFlags,
                                                   (ulong)(Type)paramInfo);
                                if (!bVar3) {
                                  local_e0 = 6;
                                  goto LAB_00db26f9;
                                }
                              }
                              bVar3 = BufferReader::Read<Js::ImplicitCallFlags>
                                                ((BufferReader *)recycler_local,&bits.field_0x2);
                              if ((((bVar3) &&
                                   (bVar3 = BufferReader::Read<Js::ThisInfo>
                                                      ((BufferReader *)recycler_local,
                                                       (ThisInfo *)((long)&recursiveInlineInfo + 2))
                                   , bVar3)) &&
                                  (bVar3 = BufferReader::Read<Js::DynamicProfileInfo::Bits>
                                                     ((BufferReader *)recycler_local,
                                                      (Bits *)((long)&
                                                  __autoNestedHandledExceptionType.savedData.
                                                  handledExceptionType + 1)), bVar3)) &&
                                 (bVar3 = BufferReader::Read<unsigned_int>
                                                    ((BufferReader *)recycler_local,&local_c8),
                                 bVar3)) {
                                if ((Type)paramInfo != 0) {
                                  register0x00000000 =
                                       BVFixed::New<Memory::Recycler>
                                                 ((Type)paramInfo * 2,(Recycler *)functionId_local,
                                                  false);
                                  pRVar6 = recycler_local;
                                  data = BVFixed::GetData(register0x00000000);
                                  BVar4 = BVFixed::WordCount(stack0xffffffffffffff48);
                                  bVar3 = BufferReader::ReadArray<BVUnitT<unsigned_long>>
                                                    ((BufferReader *)pRVar6,data,(ulong)BVar4);
                                  if (!bVar3) {
                                    local_e0 = 6;
                                    goto LAB_00db26f9;
                                  }
                                }
                                pLVar2 = functionId_local;
                                Memory::TrackAllocData::CreateTrackAllocData
                                          (&local_3e8,
                                           (type_info *)&DynamicProfileFunctionInfo::typeinfo,0,
                                           0xffffffffffffffff,
                                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                           ,0x998);
                                pRVar6 = Memory::Recycler::TrackAllocInfo
                                                   ((Recycler *)pLVar2,&local_3e8);
                                dynamicProfileInfo =
                                     (DynamicProfileInfo *)Memory::Recycler::AllocLeafInlined;
                                local_3f0 = 0;
                                local_3c0 = (DynamicProfileFunctionInfo *)
                                            new<Memory::Recycler>(0x20,pRVar6,0xa38830);
                                pLVar2 = functionId_local;
                                local_3c0->paramInfoCount = arrayCallSiteCount;
                                local_3c0->ldLenInfoCount = slotInfoCount;
                                local_3c0->ldElemInfoCount = callSiteInfoCount;
                                local_3c0->stElemInfoCount = callApplyTargetInfoCount;
                                local_3c0->arrayCallSiteCount = returnTypeInfoCount;
                                local_3c0->fldInfoCount = paramInfo._4_4_;
                                local_3c0->slotInfoCount = divCount;
                                local_3c0->callSiteInfoCount = switchCount;
                                local_3c0->callApplyTargetInfoCount = local_38;
                                local_3c0->divCount = (Type)fldInfoCount;
                                local_3c0->switchCount = loopCount._2_2_;
                                local_3c0->returnTypeInfoCount = fldInfoCount._2_2_;
                                local_3c0->loopCount = (Type)paramInfo;
                                Memory::TrackAllocData::CreateTrackAllocData
                                          (&local_428,(type_info *)&typeinfo,0,0xffffffffffffffff,
                                           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                           ,0x9a7);
                                pRVar6 = Memory::Recycler::TrackAllocInfo
                                                   ((Recycler *)pLVar2,&local_428);
                                this = (DynamicProfileInfo *)
                                       new<Memory::Recycler>(0xa8,pRVar6,0x43c4b0);
                                DynamicProfileInfo(this);
                                local_400 = this;
                                Memory::WriteBarrierPtr<Js::DynamicProfileFunctionInfo>::operator=
                                          ((WriteBarrierPtr<Js::DynamicProfileFunctionInfo> *)this,
                                           local_3c0);
                                Memory::WriteBarrierPtr<ValueType>::operator=
                                          (&local_400->parameterInfo,&ldLenInfo->arrayType);
                                Memory::WriteBarrierPtr<Js::LdLenInfo>::operator=
                                          (&local_400->ldLenInfo,(LdLenInfo *)ldElemInfo);
                                Memory::WriteBarrierPtr<Js::LdElemInfo>::operator=
                                          (&local_400->ldElemInfo,(LdElemInfo *)stElemInfo);
                                Memory::WriteBarrierPtr<Js::StElemInfo>::operator=
                                          (&local_400->stElemInfo,(StElemInfo *)arrayCallSiteInfo);
                                Memory::WriteBarrierPtr<Js::ArrayCallSiteInfo>::operator=
                                          (&local_400->arrayCallSiteInfo,
                                           (ArrayCallSiteInfo *)fldInfo);
                                Memory::WriteBarrierPtr<Js::FldInfo>::operator=
                                          (&local_400->fldInfo,(FldInfo *)slotInfo);
                                Memory::WriteBarrierPtr<ValueType>::operator=
                                          (&local_400->slotInfo,&callSiteInfo->returnType);
                                Memory::WriteBarrierPtr<Js::CallSiteInfo>::operator=
                                          (&local_400->callSiteInfo,callApplyTargetInfo);
                                Memory::WriteBarrierPtr<Js::CallSiteInfo>::operator=
                                          (&local_400->callApplyTargetInfo,
                                           (CallSiteInfo *)divTypeInfo);
                                Memory::WriteBarrierPtr<ValueType>::operator=
                                          (&local_400->divideTypeInfo,switchTypeInfo);
                                Memory::WriteBarrierPtr<ValueType>::operator=
                                          (&local_400->switchTypeInfo,returnTypeInfo);
                                Memory::WriteBarrierPtr<ValueType>::operator=
                                          (&local_400->returnTypeInfo,
                                           (ValueType *)loopImplicitCallFlags);
                                Memory::WriteBarrierPtr<Js::ImplicitCallFlags>::operator=
                                          (&local_400->loopImplicitCallFlags,
                                           (ImplicitCallFlags *)loopFlags);
                                local_400->implicitCallFlags = bits._2_1_;
                                Memory::WriteBarrierPtr<BVFixed>::operator=
                                          (&local_400->loopFlags,stack0xffffffffffffff48);
                                (local_400->thisInfo).thisType = local_bc;
                                (local_400->thisInfo).valueType.field_0 = recursiveInlineInfo._2_2_;
                                (local_400->bits).field_0x4 = recursiveInlineInfo._1_1_;
                                *(undefined4 *)&local_400->bits = stack0xffffffffffffff3d;
                                local_400->m_recursiveInlineInfo = local_c8;
                                ResetAllPolymorphicCallSiteInfo(local_400);
                                reader_local = (BufferReader *)local_400;
                                local_e0 = 1;
                              }
                              else {
                                local_e0 = 6;
                              }
                            }
                            else {
                              local_e0 = 6;
                            }
                          }
                          else {
                            local_e0 = 6;
                          }
                        }
                        else {
                          local_e0 = 6;
                        }
                      }
                      else {
                        local_e0 = 6;
                      }
                    }
                    else {
                      local_e0 = 6;
                    }
                  }
                  else {
                    local_e0 = 6;
                  }
                }
                else {
                  local_e0 = 6;
                }
              }
              else {
                local_e0 = 6;
              }
            }
            else {
              local_e0 = 6;
            }
          }
          else {
            local_e0 = 6;
          }
        }
        else {
          local_e0 = 6;
        }
      }
      else {
        local_e0 = 6;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x8cc,"(false)","false");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      reader_local = (BufferReader *)0x0;
      local_e0 = 1;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x8c6,"(false)","false");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    reader_local = (BufferReader *)0x0;
    local_e0 = 1;
  }
LAB_00db26f9:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_cc);
  if (local_e0 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x9c6,"(false)","false");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    reader_local = (BufferReader *)0x0;
  }
  return (DynamicProfileInfo *)reader_local;
}

Assistant:

DynamicProfileInfo * DynamicProfileInfo::Deserialize(T * reader, Recycler* recycler, Js::LocalFunctionId * functionId)
    {
        Js::ArgSlot paramInfoCount = 0;
        ProfileId ldLenInfoCount = 0;
        ProfileId ldElemInfoCount = 0;
        ProfileId stElemInfoCount = 0;
        ProfileId arrayCallSiteCount = 0;
        ProfileId slotInfoCount = 0;
        ProfileId callSiteInfoCount = 0;
        ProfileId callApplyTargetInfoCount = 0;
        ProfileId returnTypeInfoCount = 0;
        ProfileId divCount = 0;
        ProfileId switchCount = 0;
        uint fldInfoCount = 0;
        uint loopCount = 0;
        ValueType * paramInfo = nullptr;
        LdLenInfo * ldLenInfo = nullptr;
        LdElemInfo * ldElemInfo = nullptr;
        StElemInfo * stElemInfo = nullptr;
        ArrayCallSiteInfo * arrayCallSiteInfo = nullptr;
        FldInfo * fldInfo = nullptr;
        ValueType * slotInfo = nullptr;
        CallSiteInfo * callSiteInfo = nullptr;
        CallSiteInfo * callApplyTargetInfo = nullptr;
        ValueType * divTypeInfo = nullptr;
        ValueType * switchTypeInfo = nullptr;
        ValueType * returnTypeInfo = nullptr;
        ImplicitCallFlags * loopImplicitCallFlags = nullptr;
        BVFixed * loopFlags = nullptr;
        ImplicitCallFlags implicitCallFlags;
        ThisInfo thisInfo;
        Bits bits;
        uint32 recursiveInlineInfo = 0;

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);

            if (!reader->Read(functionId))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (!reader->Read(&paramInfoCount))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (paramInfoCount != 0)
            {
                paramInfo = RecyclerNewArrayLeaf(recycler, ValueType, paramInfoCount);
                if (!reader->ReadArray(paramInfo, paramInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldLenInfoCount))
            {
                goto Error;
            }

            if (ldLenInfoCount != 0)
            {
                ldLenInfo = RecyclerNewArrayLeaf(recycler, LdLenInfo, ldLenInfoCount);
                if (!reader->ReadArray(ldLenInfo, ldLenInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldElemInfoCount))
            {
                goto Error;
            }

            if (ldElemInfoCount != 0)
            {
                ldElemInfo = RecyclerNewArrayLeaf(recycler, LdElemInfo, ldElemInfoCount);
                if (!reader->ReadArray(ldElemInfo, ldElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&stElemInfoCount))
            {
                goto Error;
            }

            if (stElemInfoCount != 0)
            {
                stElemInfo = RecyclerNewArrayLeaf(recycler, StElemInfo, stElemInfoCount);
                if (!reader->ReadArray(stElemInfo, stElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&arrayCallSiteCount))
            {
                goto Error;
            }

            if (arrayCallSiteCount != 0)
            {
                arrayCallSiteInfo = RecyclerNewArrayLeaf(recycler, ArrayCallSiteInfo, arrayCallSiteCount);
                if (!reader->ReadArray(arrayCallSiteInfo, arrayCallSiteCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&fldInfoCount))
            {
                goto Error;
            }

            if (fldInfoCount != 0)
            {
                fldInfo = RecyclerNewArrayLeaf(recycler, FldInfo, fldInfoCount);
                if (!reader->ReadArray(fldInfo, fldInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&slotInfoCount))
            {
                goto Error;
            }

            if (slotInfoCount != 0)
            {
                slotInfo = RecyclerNewArrayLeaf(recycler, ValueType, slotInfoCount);
                if (!reader->ReadArray(slotInfo, slotInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callSiteInfoCount))
            {
                goto Error;
            }

            if (callSiteInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callSiteInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callSiteInfoCount);
                if (!reader->ReadArray(callSiteInfo, callSiteInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callApplyTargetInfoCount))
            {
                goto Error;
            }

            if (callApplyTargetInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callApplyTargetInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callApplyTargetInfoCount);
                if (!reader->ReadArray(callApplyTargetInfo, callApplyTargetInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&divCount))
            {
                goto Error;
            }

            if (divCount != 0)
            {
                divTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, divCount);
                if (!reader->ReadArray(divTypeInfo, divCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&switchCount))
            {
                goto Error;
            }

            if (switchCount != 0)
            {
                switchTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, switchCount);
                if (!reader->ReadArray(switchTypeInfo, switchCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&returnTypeInfoCount))
            {
                goto Error;
            }

            if (returnTypeInfoCount != 0)
            {
                returnTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, returnTypeInfoCount);
                if (!reader->ReadArray(returnTypeInfo, returnTypeInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&loopCount))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopImplicitCallFlags = RecyclerNewArrayLeaf(recycler, ImplicitCallFlags, loopCount);
                if (!reader->ReadArray(loopImplicitCallFlags, loopCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&implicitCallFlags) ||
                !reader->Read(&thisInfo) ||
                !reader->Read(&bits) ||
                !reader->Read(&recursiveInlineInfo))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopFlags = BVFixed::New(loopCount * LoopFlags::COUNT, recycler);
                if (!reader->ReadArray(loopFlags->GetData(), loopFlags->WordCount()))
                {
                    goto Error;
                }
            }

            DynamicProfileFunctionInfo * dynamicProfileFunctionInfo = RecyclerNewStructLeaf(recycler, DynamicProfileFunctionInfo);
            dynamicProfileFunctionInfo->paramInfoCount = paramInfoCount;
            dynamicProfileFunctionInfo->ldLenInfoCount = ldLenInfoCount;
            dynamicProfileFunctionInfo->ldElemInfoCount = ldElemInfoCount;
            dynamicProfileFunctionInfo->stElemInfoCount = stElemInfoCount;
            dynamicProfileFunctionInfo->arrayCallSiteCount = arrayCallSiteCount;
            dynamicProfileFunctionInfo->fldInfoCount = fldInfoCount;
            dynamicProfileFunctionInfo->slotInfoCount = slotInfoCount;
            dynamicProfileFunctionInfo->callSiteInfoCount = callSiteInfoCount;
            dynamicProfileFunctionInfo->callApplyTargetInfoCount = callApplyTargetInfoCount;
            dynamicProfileFunctionInfo->divCount = divCount;
            dynamicProfileFunctionInfo->switchCount = switchCount;
            dynamicProfileFunctionInfo->returnTypeInfoCount = returnTypeInfoCount;
            dynamicProfileFunctionInfo->loopCount = loopCount;

            DynamicProfileInfo * dynamicProfileInfo = RecyclerNew(recycler, DynamicProfileInfo);
            dynamicProfileInfo->dynamicProfileFunctionInfo = dynamicProfileFunctionInfo;
            dynamicProfileInfo->parameterInfo = paramInfo;
            dynamicProfileInfo->ldLenInfo = ldLenInfo;
            dynamicProfileInfo->ldElemInfo = ldElemInfo;
            dynamicProfileInfo->stElemInfo = stElemInfo;
            dynamicProfileInfo->arrayCallSiteInfo = arrayCallSiteInfo;
            dynamicProfileInfo->fldInfo = fldInfo;
            dynamicProfileInfo->slotInfo = slotInfo;
            dynamicProfileInfo->callSiteInfo = callSiteInfo;
            dynamicProfileInfo->callApplyTargetInfo = callApplyTargetInfo;
            dynamicProfileInfo->divideTypeInfo = divTypeInfo;
            dynamicProfileInfo->switchTypeInfo = switchTypeInfo;
            dynamicProfileInfo->returnTypeInfo = returnTypeInfo;
            dynamicProfileInfo->loopImplicitCallFlags = loopImplicitCallFlags;
            dynamicProfileInfo->implicitCallFlags = implicitCallFlags;
            dynamicProfileInfo->loopFlags = loopFlags;
            dynamicProfileInfo->thisInfo = thisInfo;
            dynamicProfileInfo->bits = bits;
            dynamicProfileInfo->m_recursiveInlineInfo = recursiveInlineInfo;

            // Fixed functions and object type data is not serialized. There is no point in trying to serialize polymorphic call site info.
            dynamicProfileInfo->ResetAllPolymorphicCallSiteInfo();

            return dynamicProfileInfo;
        }
        catch (OutOfMemoryException)
        {
        }

    Error:
        AssertOrFailFast(false);
        return nullptr;
    }